

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *softmaxInputName,
               char *targetName)

{
  NetworkUpdateParameters *pNVar1;
  LossLayer *this;
  CategoricalCrossEntropyLossLayer *this_00;
  ModelDescription *pMVar2;
  FeatureDescription *this_01;
  FeatureType *this_02;
  ArrayFeatureType *this_03;
  
  pNVar1 = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                   (&pNVar1->losslayers_);
  CoreML::Specification::LossLayer::set_name(this,lossName);
  this_00 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(this);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(this_00,softmaxInputName);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(this_00,targetName);
  pMVar2 = CoreML::Specification::Model::mutable_description(m);
  this_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(this_01,(this_00->target_).ptr_);
  this_02 = CoreML::Specification::FeatureDescription::mutable_type(this_01);
  this_03 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_02);
  this_03->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(this_03,1);
  return;
}

Assistant:

void addCategoricalCrossEntropyLoss(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *softmaxInputName, const char *targetName) {

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxInputName);
    ceLossLayer->set_target(targetName);

    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

}